

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderSupplementalData.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderSupplementalData::Mode5TransponderSupplementalData
          (Mode5TransponderSupplementalData *this,KBOOL Squitter,KBOOL Lvl2Squitter,
          KUINT8 IFFMission)

{
  KException *this_00;
  KString local_48;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5TransponderSupplementalData_0022c0d8;
  if (IFFMission < 8) {
    (this->m_SupplementalDataUnion).m_ui8SupplementalData =
         IFFMission << 2 | Lvl2Squitter * '\x02' | Squitter;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Mode5TransponderSupplementalData","");
  KException::KException(this_00,&local_48,4);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

Mode5TransponderSupplementalData::Mode5TransponderSupplementalData(KBOOL Squitter, KBOOL Lvl2Squitter,
																   KUINT8 IFFMission) noexcept(false)
{
	if( IFFMission > 7 )throw KException( __FUNCTION__, DATA_TYPE_TOO_LARGE );
	m_SupplementalDataUnion.m_ui8SupplementalData = 0;
	m_SupplementalDataUnion.m_ui8SquitterStatus = Squitter;
	m_SupplementalDataUnion.m_ui8Lvl2SquitterStatus = Lvl2Squitter;
	m_SupplementalDataUnion.m_ui8IFFMission = IFFMission;
}